

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O0

IEnumerableCore<linq::SkipState<linq::IEnumerable<int>,_int>_> * __thiscall
linq::IEnumerable<int>::Skip
          (IEnumerableCore<linq::SkipState<linq::IEnumerable<int>,_int>_> *__return_storage_ptr__,
          IEnumerable<int> *this,size_t count)

{
  IEnumerableCore<linq::IEnumerable<int>_> local_38;
  size_t local_20;
  size_t count_local;
  IEnumerable<int> *this_local;
  
  local_20 = count;
  count_local = (size_t)this;
  this_local = (IEnumerable<int> *)__return_storage_ptr__;
  IEnumerableCore<linq::IEnumerable<int>_>::IEnumerableCore(&local_38,this);
  IEnumerableCore<linq::IEnumerable<int>_>::Skip(__return_storage_ptr__,&local_38,local_20);
  IEnumerableCore<linq::IEnumerable<int>_>::~IEnumerableCore(&local_38);
  return __return_storage_ptr__;
}

Assistant:

IEnumerableCore<SkipState<IEnumerable<T>, T>> IEnumerable<T>::Skip(size_t count) { return IEnumerableCore<IEnumerable<T>>(std::move(*this)).Skip(count); }